

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  ITracker *pIVar1;
  undefined1 auVar2 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  size_t local_48;
  undefined1 local_40 [24];
  undefined8 uStack_28;
  char *local_20;
  undefined8 local_18;
  
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               "{root}",6);
  local_40._0_8_ = local_40 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ == &local_58) {
    uStack_28 = local_58._8_8_;
  }
  else {
    local_40._0_8_ = local_68._0_8_;
  }
  local_40._8_8_ = local_68._8_8_;
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
  ;
  local_18 = 0x1a34;
  local_48 = 0;
  local_68._0_8_ = &local_58;
  Detail::
  make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            ((NameAndLocation *)local_70,(TrackerContext *)local_40,(void **)this);
  auVar2 = local_70;
  local_70 = (undefined1  [8])0x0;
  pIVar1 = (this->m_rootTracker).m_ptr;
  if (pIVar1 == (ITracker *)0x0) {
    (this->m_rootTracker).m_ptr = (ITracker *)auVar2;
  }
  else {
    (*pIVar1->_vptr_ITracker[1])();
    (this->m_rootTracker).m_ptr = (ITracker *)auVar2;
    if (local_70 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_70 + 8))();
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_68);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).m_ptr;
}

Assistant:

ITracker& TrackerContext::startRun() {
        using namespace std::string_literals;
        m_rootTracker = Catch::Detail::make_unique<SectionTracker>(
            NameAndLocation( "{root}"s, CATCH_INTERNAL_LINEINFO ),
            *this,
            nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }